

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_nullddi.cpp
# Opt level: O0

ze_result_t driver::zetMetricDecoderDestroyExp(zet_metric_decoder_exp_handle_t phMetricDecoder)

{
  zet_pfnMetricDecoderDestroyExp_t pfnDestroyExp;
  ze_result_t result;
  zet_metric_decoder_exp_handle_t phMetricDecoder_local;
  
  pfnDestroyExp._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c7e8 != (code *)0x0) {
    pfnDestroyExp._4_4_ = (*DAT_0011c7e8)(phMetricDecoder);
  }
  return pfnDestroyExp._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetMetricDecoderDestroyExp(
        zet_metric_decoder_exp_handle_t phMetricDecoder ///< [in] handle of the metric decoder object
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnDestroyExp = context.zetDdiTable.MetricDecoderExp.pfnDestroyExp;
        if( nullptr != pfnDestroyExp )
        {
            result = pfnDestroyExp( phMetricDecoder );
        }
        else
        {
            // generic implementation
        }

        return result;
    }